

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

int aom_satd_lp_sse2(int16_t *coeff,int length)

{
  short *psVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  long lVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  undefined1 auVar28 [16];
  int iVar31;
  undefined1 auVar32 [16];
  
  iVar27 = 0;
  iVar29 = 0;
  iVar30 = 0;
  iVar31 = 0;
  if (0 < length) {
    lVar26 = 0;
    do {
      psVar1 = coeff + lVar26;
      sVar10 = *psVar1;
      sVar11 = psVar1[1];
      sVar12 = psVar1[2];
      sVar13 = psVar1[3];
      sVar14 = psVar1[4];
      sVar15 = psVar1[5];
      sVar16 = psVar1[6];
      sVar17 = psVar1[7];
      psVar1 = coeff + lVar26 + 8;
      sVar18 = *psVar1;
      sVar19 = psVar1[1];
      sVar20 = psVar1[2];
      sVar21 = psVar1[3];
      sVar22 = psVar1[4];
      sVar23 = psVar1[5];
      sVar24 = psVar1[6];
      sVar25 = psVar1[7];
      sVar2 = -sVar10;
      sVar3 = -sVar11;
      sVar4 = -sVar12;
      sVar5 = -sVar13;
      sVar6 = -sVar14;
      sVar7 = -sVar15;
      sVar8 = -sVar16;
      sVar9 = -sVar17;
      auVar32._0_2_ = (ushort)(sVar2 < sVar10) * sVar10 | (ushort)(sVar2 >= sVar10) * sVar2;
      auVar32._2_2_ = (ushort)(sVar3 < sVar11) * sVar11 | (ushort)(sVar3 >= sVar11) * sVar3;
      auVar32._4_2_ = (ushort)(sVar4 < sVar12) * sVar12 | (ushort)(sVar4 >= sVar12) * sVar4;
      auVar32._6_2_ = (ushort)(sVar5 < sVar13) * sVar13 | (ushort)(sVar5 >= sVar13) * sVar5;
      auVar32._8_2_ = (ushort)(sVar6 < sVar14) * sVar14 | (ushort)(sVar6 >= sVar14) * sVar6;
      auVar32._10_2_ = (ushort)(sVar7 < sVar15) * sVar15 | (ushort)(sVar7 >= sVar15) * sVar7;
      auVar32._12_2_ = (ushort)(sVar8 < sVar16) * sVar16 | (ushort)(sVar8 >= sVar16) * sVar8;
      auVar32._14_2_ = (ushort)(sVar9 < sVar17) * sVar17 | (ushort)(sVar9 >= sVar17) * sVar9;
      auVar32 = pmaddwd(auVar32,_DAT_005154e0);
      sVar2 = -sVar18;
      sVar3 = -sVar19;
      sVar4 = -sVar20;
      sVar5 = -sVar21;
      sVar6 = -sVar22;
      sVar7 = -sVar23;
      sVar8 = -sVar24;
      sVar9 = -sVar25;
      auVar28._0_2_ = (ushort)(sVar2 < sVar18) * sVar18 | (ushort)(sVar2 >= sVar18) * sVar2;
      auVar28._2_2_ = (ushort)(sVar3 < sVar19) * sVar19 | (ushort)(sVar3 >= sVar19) * sVar3;
      auVar28._4_2_ = (ushort)(sVar4 < sVar20) * sVar20 | (ushort)(sVar4 >= sVar20) * sVar4;
      auVar28._6_2_ = (ushort)(sVar5 < sVar21) * sVar21 | (ushort)(sVar5 >= sVar21) * sVar5;
      auVar28._8_2_ = (ushort)(sVar6 < sVar22) * sVar22 | (ushort)(sVar6 >= sVar22) * sVar6;
      auVar28._10_2_ = (ushort)(sVar7 < sVar23) * sVar23 | (ushort)(sVar7 >= sVar23) * sVar7;
      auVar28._12_2_ = (ushort)(sVar8 < sVar24) * sVar24 | (ushort)(sVar8 >= sVar24) * sVar8;
      auVar28._14_2_ = (ushort)(sVar9 < sVar25) * sVar25 | (ushort)(sVar9 >= sVar25) * sVar9;
      auVar28 = pmaddwd(auVar28,_DAT_005154e0);
      iVar27 = auVar28._0_4_ + auVar32._0_4_ + iVar27;
      iVar29 = auVar28._4_4_ + auVar32._4_4_ + iVar29;
      iVar30 = auVar28._8_4_ + auVar32._8_4_ + iVar30;
      iVar31 = auVar28._12_4_ + auVar32._12_4_ + iVar31;
      lVar26 = lVar26 + 0x10;
    } while ((int)lVar26 < length);
  }
  return iVar31 + iVar29 + iVar30 + iVar27;
}

Assistant:

int aom_satd_lp_sse2(const int16_t *coeff, int length) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  __m128i accum = zero;

  for (int i = 0; i < length; i += 16) {
    const __m128i src_line0 = _mm_loadu_si128((const __m128i *)coeff);
    const __m128i src_line1 = _mm_loadu_si128((const __m128i *)(coeff + 8));
    const __m128i inv0 = _mm_sub_epi16(zero, src_line0);
    const __m128i inv1 = _mm_sub_epi16(zero, src_line1);
    const __m128i abs0 = _mm_max_epi16(src_line0, inv0);  // abs(src_line)
    const __m128i abs1 = _mm_max_epi16(src_line1, inv1);  // abs(src_line)
    const __m128i sum0 = _mm_madd_epi16(abs0, one);
    const __m128i sum1 = _mm_madd_epi16(abs1, one);
    accum = _mm_add_epi32(accum, sum0);
    accum = _mm_add_epi32(accum, sum1);
    coeff += 16;
  }

  {  // cascading summation of accum
    __m128i hi = _mm_srli_si128(accum, 8);
    accum = _mm_add_epi32(accum, hi);
    hi = _mm_srli_epi64(accum, 32);
    accum = _mm_add_epi32(accum, hi);
  }

  return _mm_cvtsi128_si32(accum);
}